

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O2

uint8_t __thiscall ymfm::ymf288::read_status_hi(ymf288 *this)

{
  byte set;
  char cVar1;
  byte bVar2;
  
  set = ~this->m_flag_control & (this->m_fm).m_status & 3;
  fm_engine_base<ymfm::opn_registers_base<true>_>::set_reset_status
            ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm,set,~set);
  cVar1 = (*(code *)((this->m_fm).m_intf)->m_engine[4]._vptr_ymfm_engine_callbacks)();
  bVar2 = set + 0x80;
  if (cVar1 == '\0') {
    bVar2 = set;
  }
  return bVar2;
}

Assistant:

uint8_t ymf288::read_status_hi()
{
	// fetch regular status
	uint8_t status = m_fm.status() & (fm_engine::STATUS_TIMERA | fm_engine::STATUS_TIMERB);

	// turn off any bits that have been requested to be masked
	status &= ~(m_flag_control & 0x03);

	// update the status so that IRQs are propagated
	m_fm.set_reset_status(status, ~status);

	// merge in the busy flag
	if (m_fm.intf().ymfm_is_busy())
		status |= fm_engine::STATUS_BUSY;
	return status;
}